

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O3

bool __thiscall Uniforms::addSequence(Uniforms *this,string *_name,string *_filename)

{
  pointer pUVar1;
  pointer pUVar2;
  char cVar3;
  istream *piVar4;
  mapped_type *this_00;
  vector<UniformData,_std::allocator<UniformData>_> uniform_data_sequence;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  UniformData data;
  ifstream infile;
  vector<UniformData,_std::allocator<UniformData>_> local_308;
  string local_2e8;
  string *local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  UniformData local_2a8;
  long local_238 [65];
  
  local_308.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream((istream *)local_238,(string *)_filename,_S_in);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2c8 = _name;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"");
  while( true ) {
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2e8,cVar3);
    pUVar2 = local_308.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pUVar1 = local_308.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    if (local_2e8._M_string_length != 0) {
      vera::split(&local_2c0,&local_2e8,',',true);
      if (local_2c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_2a8.queue.c.
        super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
        local_2a8.queue.c.
        super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
        local_2a8.queue.c.
        super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
        local_2a8.queue.c.
        super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
        local_2a8.queue.c.
        super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
        local_2a8.queue.c.
        super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
        local_2a8.queue.c.
        super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        local_2a8.queue.c.
        super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
        local_2a8.queue.c.
        super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_2a8.queue.c.
        super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
        super__Deque_impl_data._M_map_size = 0;
        std::_Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
        _M_initialize_map((_Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                           *)&local_2a8,0);
        local_2a8.size = 0;
        local_2a8.bInt = false;
        local_2a8.change = false;
        UniformData::parse(&local_2a8,&local_2c0,0,false);
        std::vector<UniformData,_std::allocator<UniformData>_>::push_back(&local_308,&local_2a8);
        std::_Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
        ~_Deque_base((_Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      *)&local_2a8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c0);
    }
  }
  if (local_308.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_308.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>_>
              ::operator[](&this->sequences,local_2c8);
    std::vector<UniformData,_std::allocator<UniformData>_>::operator=(this_00,&local_308);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_238);
  std::vector<UniformData,_std::allocator<UniformData>_>::~vector(&local_308);
  return pUVar2 != pUVar1;
}

Assistant:

bool Uniforms::addSequence( const std::string& _name, const std::string& _filename) {
    std::vector<UniformData> uniform_data_sequence;

    // Open file _filename and read all lines
    std::ifstream infile(_filename);
    std::string line = "";
    while (std::getline(infile, line)) {
        if (line.size() > 0) {
            std::vector<std::string> values = vera::split(line,',', true);
            if (values.size() > 0) {
                UniformData data;
                data.parse(values, 0, false);
                uniform_data_sequence.push_back(data);
            }
        }
    }

    // std::cout << "Load " << _name << " from " << _filename <<  " with " << uniform_data_sequence.size() << " values" << std::endl;
    if (uniform_data_sequence.size() == 0)
        return false;

    sequences[_name] = uniform_data_sequence;

    return true;
}